

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniforms.cpp
# Opt level: O2

void __thiscall
UniformData::parse(UniformData *this,
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *_command,size_t _start,bool _queue)

{
  pointer pbVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  float fVar5;
  UniformValue candidate;
  UniformValue local_40;
  
  lVar4 = _start << 5;
  lVar3 = 0;
  while( true ) {
    pbVar1 = (_command->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar2 = (long)(_command->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5;
    if ((4 < _start + lVar3) || (uVar2 <= _start + lVar3)) break;
    fVar5 = vera::toFloat((string *)((long)&(pbVar1->_M_dataplus)._M_p + lVar4));
    local_40._M_elems[lVar3] = fVar5;
    lVar4 = lVar4 + 0x20;
    lVar3 = lVar3 + 1;
  }
  set(this,&local_40,uVar2 - _start,false,_queue);
  return;
}

Assistant:

void UniformData::parse(const std::vector<std::string>& _command, size_t _start, bool _queue) {;
    UniformValue candidate;
    for (size_t i = _start; i < _command.size() && i < 5; i++) 
        candidate[i-_start] = vera::toFloat(_command[i]);

    set(candidate, _command.size() - _start, false, _queue);
}